

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,token *tok)

{
  string *s;
  allocator local_59;
  string local_58;
  string local_38;
  token *local_18;
  token *tok_local;
  ostream *ofs_local;
  
  local_18 = tok;
  tok_local = (token *)ofs;
  s = tinyusdz::Token::str_abi_cxx11_(tok);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"\"",&local_59);
  tinyusdz::quote(&local_38,s,&local_58);
  std::operator<<(ofs,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return (ostream *)tok_local;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::value::token &tok) {
  ofs << tinyusdz::quote(tok.str());

  return ofs;
}